

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cc
# Opt level: O1

void __thiscall
wabt::anon_unknown_4::ScriptValidator::CheckResultTypes
          (ScriptValidator *this,Location *loc,TypeVector *actual,TypeVector *expected,char *desc)

{
  pointer pTVar1;
  ulong uVar2;
  
  if ((long)(actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2 ==
      (long)(expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
            super__Vector_impl_data._M_start >> 2) {
    pTVar1 = (actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
        super__Vector_impl_data._M_finish != pTVar1) {
      uVar2 = 0;
      do {
        CheckTypeIndex(this,loc,(Type)pTVar1[uVar2].enum_,
                       (Type)(expected->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)
                             ._M_impl.super__Vector_impl_data._M_start[uVar2].enum_,"action",
                       (Index)uVar2,"result");
        uVar2 = uVar2 + 1;
        pTVar1 = (actual->super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>)._M_impl.
                 super__Vector_impl_data._M_start;
      } while (uVar2 < (ulong)((long)(actual->
                                     super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>).
                                     _M_impl.super__Vector_impl_data._M_finish - (long)pTVar1 >> 2))
      ;
    }
    return;
  }
  PrintError(this,loc,"expected %zd results, got %zd");
  return;
}

Assistant:

void ScriptValidator::CheckResultTypes(const Location* loc,
                                       const TypeVector& actual,
                                       const TypeVector& expected,
                                       const char* desc) {
  if (actual.size() == expected.size()) {
    for (size_t i = 0; i < actual.size(); ++i) {
      CheckTypeIndex(loc, actual[i], expected[i], desc, i, "result");
    }
  } else {
    PrintError(loc, "expected %" PRIzd " results, got %" PRIzd, expected.size(),
               actual.size());
  }
}